

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O1

void find_median<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *numbers,VectorData *vd)

{
  char *pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<signed_char,_std::allocator<signed_char>_> numbers_copy;
  vector<signed_char,_std::allocator<signed_char>_> local_38;
  
  pcVar1 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pcVar1 == 1) {
    vd->median = (double)(int)*pcVar1;
  }
  else {
    std::vector<signed_char,_std::allocator<signed_char>_>::vector(&local_38,numbers);
    pcVar2 = local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar4 = 0x3f;
      if ((long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        for (; (ulong)((long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> lVar4 == 0;
            lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pcVar2,local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar2 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = (ulong)((long)pcVar3 - (long)pcVar2) >> 1;
    uVar7 = (long)pcVar3 - (long)pcVar2;
    if (uVar7 == 0) {
      uVar5 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
LAB_001047a0:
      uVar6 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar5);
      if (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar6);
    }
    vd->median = (double)(int)pcVar2[uVar8];
    if ((uVar7 & 1) == 0) {
      uVar5 = uVar8 - 1;
      if (uVar7 <= uVar5) goto LAB_001047a0;
      vd->median = ((double)(int)pcVar2[uVar8 - 1] + (double)(int)pcVar2[uVar8]) * 0.5;
    }
    if (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void find_median(const std::vector<Number>& numbers,
	VectorData& vd)
{
	if (numbers.size() == 1)
	{
		vd.median = numbers.at(0);
		return;
	}

	std::vector<Number> numbers_copy(numbers);
	std::sort(numbers_copy.begin(), numbers_copy.end());

	size_t pos = numbers.size() / 2;
	vd.median = numbers.at(pos);

	if (numbers.size() % 2 == 0)
	{
		double upper = numbers.at(pos);
		double lower = numbers.at(pos - 1);
		vd.median = (upper + lower) / 2.0;
	}
}